

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::SIMDReplaceOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDReplaceOp>::
add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
          (FeatureOptions<wasm::SIMDReplaceOp> *this,FeatureSet feature,SIMDReplaceOp option,
          SIMDReplaceOp rest,SIMDReplaceOp rest_1,SIMDReplaceOp rest_2,SIMDReplaceOp rest_3)

{
  iterator __position;
  vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>> *this_00;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar1;
  FeatureSet local_38;
  SIMDReplaceOp local_34;
  FeatureSet feature_local;
  SIMDReplaceOp option_local;
  
  _local_38 = CONCAT44(option,feature.features);
  this_00 = (vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
            ::operator[](&this->options,&local_38);
  __position._M_current = *(SIMDReplaceOp **)(this_00 + 8);
  if (__position._M_current == *(SIMDReplaceOp **)(this_00 + 0x10)) {
    std::vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>>::
    _M_realloc_insert<wasm::SIMDReplaceOp_const&>(this_00,__position,&local_34);
  }
  else {
    *__position._M_current = option;
    *(SIMDReplaceOp **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
                     (this,local_38,rest,rest_1,rest_2,rest_3);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }